

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

bool __thiscall
docopt::OneOrMore::match
          (OneOrMore *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  __shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  bool bVar5;
  undefined1 local_88 [7];
  bool firstLoop;
  PatternList l_;
  size_t times;
  bool matched;
  undefined1 local_58 [8];
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  PatternList l;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *collected_local;
  PatternList *left_local;
  OneOrMore *this_local;
  
  sVar3 = std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::size(&(this->super_BranchPattern).fChildren);
  if (sVar3 != 1) {
    __assert_fail("fChildren.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt_private.h"
                  ,0x25f,
                  "virtual bool docopt::OneOrMore::match(PatternList &, std::vector<std::shared_ptr<LeafPattern>> &) const"
                 );
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)&c.
               super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,left);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
            *)local_58,collected);
  times._3_1_ = 1;
  l_.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)local_88);
  bVar5 = true;
  while (times._3_1_ != 0) {
    this_00 = (__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ::operator[](&(this->super_BranchPattern).fChildren,0);
    peVar4 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    uVar2 = (*peVar4->_vptr_Pattern[2])
                      (peVar4,&c.
                               super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_58);
    times._3_1_ = (byte)uVar2 & 1;
    if ((uVar2 & 1) != 0) {
      l_.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((l_.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    + 1);
    }
    if (bVar5) {
      bVar5 = false;
    }
    else {
      bVar1 = std::operator==((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                               *)&c.
                                  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                               *)local_88);
      if (bVar1) break;
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator=((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)local_88,
              (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)&c.
                  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  bVar5 = l_.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
  if (bVar5) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator=(left,(vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)&c.
                       super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::operator=(collected,
                (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                 *)local_58);
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_88);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
             *)local_58);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&c.
                super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return bVar5;
}

Assistant:

inline bool OneOrMore::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		assert(fChildren.size() == 1);

		auto l = left;
		auto c = collected;

		bool matched = true;
		size_t times = 0;

		decltype(l) l_;
		bool firstLoop = true;

		while (matched) {
			// could it be that something didn't match but changed l or c?
			matched = fChildren[0]->match(l, c);

			if (matched)
				++times;

			if (firstLoop) {
				firstLoop = false;
			} else if (l == l_) {
				break;
			}

			l_ = l;
		}

		if (times == 0) {
			return false;
		}

		left = std::move(l);
		collected = std::move(c);
		return true;
	}